

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

Logon * anon_unknown.dwarf_52c65e::createLogon
                  (Logon *__return_storage_ptr__,char *sender,char *target,int seq)

{
  undefined1 *this;
  int iVar1;
  Logon *extraout_RAX;
  FieldBase local_80;
  
  FIX42::Logon::Logon(__return_storage_ptr__);
  FIX::IntField::IntField((IntField *)&local_80,0x62,0);
  local_80._vptr_FieldBase = (_func_int **)&PTR__FieldBase_003273c0;
  FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,&local_80,true);
  FIX::FieldBase::~FieldBase(&local_80);
  FIX::IntField::IntField((IntField *)&local_80,0x6c,0x1e);
  local_80._vptr_FieldBase = (_func_int **)&PTR__FieldBase_003273f8;
  FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,&local_80,true);
  FIX::FieldBase::~FieldBase(&local_80);
  this = &(__return_storage_ptr__->super_Message).field_0x70;
  fillHeader((Header *)this,sender,target,seq);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::IntField::IntField((IntField *)&local_80,9,iVar1);
  local_80._vptr_FieldBase = (_func_int **)&PTR__FieldBase_003253c8;
  FIX::FieldMap::setField((FieldMap *)this,&local_80,true);
  FIX::FieldBase::~FieldBase(&local_80);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSumField::CheckSumField((CheckSumField *)&local_80,10,iVar1);
  local_80._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00325560;
  FIX::FieldMap::setField
            ((FieldMap *)&(__return_storage_ptr__->super_Message).field_0xe0,&local_80,true);
  FIX::FieldBase::~FieldBase(&local_80);
  return extraout_RAX;
}

Assistant:

FIX42::Logon createLogon(const char *sender, const char *target, int seq) {
  FIX42::Logon logon;
  logon.set(EncryptMethod(0));
  logon.set(HeartBtInt(30));
  fillHeader(logon.getHeader(), sender, target, seq);
  logon.getHeader().setField(BodyLength(logon.bodyLength()));
  logon.getTrailer().setField(CheckSum(logon.checkSum()));
  return logon;
}